

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direction.hh
# Opt level: O3

void __thiscall Direction::Direction(Direction *this,int i,int j)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  char str [200];
  char acStack_d8 [208];
  
  this->i = i;
  this->j = j;
  iVar1 = -i;
  if (0 < i) {
    iVar1 = i;
  }
  iVar3 = -j;
  if (0 < j) {
    iVar3 = j;
  }
  if ((uint)(iVar3 + iVar1) < 2) {
    return;
  }
  sprintf(acStack_d8,"Incorrect direction %d %d",i);
  poVar2 = std::operator<<((ostream *)&std::cout,"Error[");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/../state/direction.hh"
                          );
  poVar2 = std::operator<<(poVar2,"][");
  poVar2 = std::operator<<(poVar2,"Direction");
  poVar2 = std::operator<<(poVar2,"][Line ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,acStack_d8);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

Direction(int i, int j) : i(i), j(j) {
        ensure(between(abs(i) + abs(j), 0, 1), "Incorrect direction %d %d", i, j);
    }